

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrcmp.cpp
# Opt level: O1

ulong __thiscall
CVmObjStrComp::write_to_stream(CVmObjStrComp *this,CVmStream *str,ulong *bytes_avail)

{
  uint *puVar1;
  long lVar2;
  long lVar3;
  uint *puVar4;
  ulong uVar5;
  long lVar6;
  vmobj_strcmp_ext *ext;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long *plVar10;
  uint *puVar11;
  ulong uVar12;
  uint local_4c;
  
  puVar1 = (uint *)(this->super_CVmObject).ext_;
  puVar11 = puVar1 + 4;
  uVar12 = 0;
  uVar9 = 0;
  lVar6 = 0;
  puVar4 = puVar11;
  do {
    if (*(long *)puVar4 != 0) {
      lVar8 = 0;
      do {
        plVar10 = *(long **)(*(long *)puVar4 + lVar8 * 8);
        if (plVar10 != (long *)0x0) {
          uVar9 = uVar9 + 1;
          uVar12 = uVar12 + *plVar10;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x100);
    }
    lVar6 = lVar6 + 1;
    puVar4 = puVar4 + 2;
  } while (lVar6 != 0x100);
  uVar5 = uVar9 * 0xb + uVar12 * 2 + 8;
  if ((bytes_avail == (ulong *)0x0) || (uVar5 <= *bytes_avail)) {
    (*str->_vptr_CVmStream[0xb])(str,(ulong)*puVar1);
    (*str->_vptr_CVmStream[0xb])(str,(ulong)(puVar1[2] != 0));
    (*str->_vptr_CVmStream[0xb])(str,uVar9 & 0xffffffff);
    (*str->_vptr_CVmStream[0xb])(str,uVar12 & 0xffffffff);
    lVar6 = 0;
    local_4c = 0;
    do {
      plVar10 = *(long **)puVar11;
      if (plVar10 != (long *)0x0) {
        lVar8 = 0;
        do {
          if (*plVar10 != 0) {
            (*str->_vptr_CVmStream[0xb])(str,(ulong)(local_4c | (uint)lVar8));
            (*str->_vptr_CVmStream[4])(str,(ulong)*(byte *)*plVar10);
            (*str->_vptr_CVmStream[0xd])(str,*(undefined8 *)(*plVar10 + 0x10));
            (*str->_vptr_CVmStream[0xd])(str,*(undefined8 *)(*plVar10 + 0x18));
            lVar2 = *(long *)*plVar10;
            if (lVar2 != 0) {
              lVar3 = ((long *)*plVar10)[1];
              lVar7 = 0;
              do {
                (*str->_vptr_CVmStream[0xb])(str,(ulong)*(uint *)(lVar3 + lVar7 * 4));
                lVar7 = lVar7 + 1;
              } while (lVar2 != lVar7);
            }
          }
          lVar8 = lVar8 + 1;
          plVar10 = plVar10 + 1;
        } while (lVar8 != 0x100);
      }
      lVar6 = lVar6 + 1;
      puVar11 = puVar11 + 2;
      local_4c = local_4c + 0x100;
    } while (lVar6 != 0x100);
  }
  return uVar5;
}

Assistant:

ulong CVmObjStrComp::write_to_stream(VMG_ CVmStream *str, ulong *bytes_avail)
{
    wchar_t ref_ch_base;
    vmobj_strcmp_ext *ext = get_ext();
    size_t i;
    vmobj_strcmp_equiv ***p;
    size_t total_value_ch;
    size_t equiv_cnt;
    size_t need_size;

    /* get the mapping totals */
    count_equiv_mappings(&equiv_cnt, &total_value_ch);

    /* 
     *   Calculate our space needs.  We need 8 bytes for the fixed header,
     *   11 bytes per equivalent mapping, and 2 bytes per value string
     *   character. 
     */
    need_size = 8 + (11 * equiv_cnt) + (2 * total_value_ch);
    
    /* if we have a size limit, check to make sure we can abide by it */
    if (bytes_avail != 0 && need_size > *bytes_avail)
    {
        /* 
         *   there's not enough space in the output stream for us, so don't
         *   write anything at all; simply return the amount of space we
         *   need 
         */
        return need_size;
    }

    /* write out the serialization structure header */
    str->write_uint2(ext->trunc_len);
    str->write_uint2(ext->case_sensitive ? 0x0001 : 0x0000);
    str->write_uint2(equiv_cnt);
    str->write_uint2(total_value_ch);

    /* run through our equivalence table again and write the mappings */
    for (ref_ch_base = 0, i = 0, p = ext->equiv ; i < countof(ext->equiv) ;
         ++i, ++p, ref_ch_base += 256)
    {
        vmobj_strcmp_equiv **ep;
        size_t j;

        /* if this first-tier mapping is unused, skip it */
        if (*p == 0)
            continue;

        /* run through our second-level table */
        for (j = 0, ep = *p ; j < 256 ; ++j, ++ep)
        {
            /* if this mapping is used, write it out */
            if (*ep != 0)
            {
                size_t k;
                wchar_t *vp;
                
                /* write the fixed part of the mapping */
                str->write_uint2(ref_ch_base + j);
                str->write_byte((uchar)(*ep)->val_ch_cnt);
                str->write_uint4((*ep)->uc_result_flags);
                str->write_uint4((*ep)->lc_result_flags);

                /* write the value mapping characters */
                for (k = (*ep)->val_ch_cnt, vp = (*ep)->val_ch ; k != 0 ;
                     --k, ++vp)
                {
                    /* write this character */
                    str->write_uint2(*vp);
                }
            }
        }
    }

    /* return our space needs */
    return need_size;
}